

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double dVar4;
  int64_t in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  TPZFMatrix<double> *in_stack_ffffffffffffff20;
  
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar2 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
  ;
  *pdVar3 = ((1.0 - dVar4) - dVar1) * 0.5 * (1.0 - dVar2);
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  col = *pdVar3 * 0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  row = col * (1.0 - *pdVar3);
  pdVar3 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff20,(int64_t)row,(int64_t)col);
  *pdVar3 = row;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  this = (TPZFMatrix<double> *)(*pdVar3 * 0.5);
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = (double)this * (1.0 - *pdVar3);
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4;
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar2 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = ((1.0 - dVar4) - dVar1) * 0.5 * (dVar2 + 1.0);
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * 0.5 * (dVar1 + 1.0);
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * 0.5 * (dVar1 + 1.0);
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (1.0 - dVar4) * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (1.0 - dVar4) * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = ((1.0 - dVar4) - dVar1) * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (1.0 - dVar4) * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = 0.0;
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = 0.0;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (1.0 - dVar4) * 0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar4 + 1.0) * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar4 + 1.0) * -0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = ((1.0 - dVar4) - dVar1) * 0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar4 + 1.0) * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = 0.0;
  pdVar3 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = 0.0;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = (dVar4 + 1.0) * 0.5;
  pdVar3 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar3;
  pdVar3 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar3 = dVar4 * 0.5;
  return;
}

Assistant:

void TPZShapePrism::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        phi(0,0)  = .5*(1.-pt[0]-pt[1])*(1.-pt[2]);
        phi(1,0)  = .5*pt[0]*(1.-pt[2]);
        phi(2,0)  = .5*pt[1]*(1.-pt[2]);
        phi(3,0)  = .5*(1.-pt[0]-pt[1])*(1.+pt[2]);
        phi(4,0)  = .5*pt[0]*(1.+pt[2]);
        phi(5,0)  = .5*pt[1]*(1.+pt[2]);
        
        dphi(0,0) = -.5*(1.-pt[2]);
        dphi(1,0) = -.5*(1.-pt[2]);
        dphi(2,0) = -.5*(1.-pt[0]-pt[1]);
        
        dphi(0,1) =  .5*(1.-pt[2]);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*pt[0];
        
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-pt[2]);
        dphi(2,2) = -.5*pt[1];
        
        dphi(0,3) = -.5*(1.+pt[2]);
        dphi(1,3) = -.5*(1.+pt[2]);
        dphi(2,3) =  .5*(1.-pt[0]-pt[1]);
        
        dphi(0,4) =  .5*(1.+pt[2]);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*pt[0];
        
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+pt[2]);
        dphi(2,5) =  .5*pt[1];
    }